

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processes.cxx
# Opt level: O3

void __thiscall
Scalar::Scalar(Scalar *this,double d,string *unitPrefix,string *unitSymbol,string *name,string *type
              )

{
  pointer pcVar1;
  string local_c8;
  string local_a8;
  undefined1 local_88 [104];
  
  StochasticProcess::StochasticProcess((StochasticProcess *)this,(Time *)0x0,name,type);
  (this->super_StochasticFunction).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__StochasticProcess_0015d528;
  (this->super_StochasticFunction).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__Scalar_0015d5d8;
  (this->super_StochasticFunction).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__Scalar_0015d620;
  this->scalarValue = d;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_StochasticFunction).super_StochasticProcess.super_Physical.
              physicalDescription);
  pcVar1 = (unitPrefix->_M_dataplus)._M_p;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar1,pcVar1 + unitPrefix->_M_string_length);
  pcVar1 = (unitSymbol->_M_dataplus)._M_p;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar1,pcVar1 + unitSymbol->_M_string_length);
  Unit::Unit((Unit *)local_88,&local_a8,&local_c8);
  Unit::operator=(&(this->super_StochasticFunction).super_StochasticProcess.super_Physical.
                   physicalUnit,(Unit *)local_88);
  Unit::~Unit((Unit *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_StochasticFunction).super_StochasticProcess.stochDescription,0,
             (char *)(this->super_StochasticFunction).super_StochasticProcess.stochDescription.
                     _M_string_length,0x14d248);
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"value","");
  Parametric::addParameter((Parametric *)this,(string *)local_88);
  if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  return;
}

Assistant:

Scalar::Scalar(double d, string unitPrefix, string unitSymbol, const string& name, const string& type)
	: StochasticFunction(0, name, type)
{
	scalarValue = d;
	physicalDescription = name;
	physicalUnit = Unit(unitPrefix, unitSymbol);
	stochDescription = "scalar";
	addParameter("value");
}